

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
     ::Destroy(SharedPayloadBase *shared)

{
  SharedPayloadBase *shared_local;
  
  if (shared != (SharedPayloadBase *)0x0) {
    ~SharedPayload((SharedPayload<testing::internal::EqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
                    *)shared);
    operator_delete(shared,0x20);
  }
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }